

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_loc.c
# Opt level: O2

int dwarf_get_loclist_c(Dwarf_Attribute attr,Dwarf_Loc_Head_c *ll_header_out,
                       Dwarf_Unsigned *listlen_out,Dwarf_Error *error)

{
  char cVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  Dwarf_CU_Context_conflict pDVar5;
  Dwarf_Debug dbg;
  long lVar6;
  Dwarf_CU_Context pDVar7;
  Dwarf_Half address_size;
  ushort uVar8;
  int iVar9;
  Dwarf_Loc_Head_c llhead;
  char *pcVar10;
  Dwarf_Locdesc_c pDVar11;
  Dwarf_Unsigned DVar12;
  Dwarf_Addr highpc;
  char *pcVar13;
  uint uVar14;
  ulong v;
  int iVar15;
  long lVar16;
  Dwarf_Unsigned DVar17;
  bool bVar18;
  Dwarf_Signed DVar19;
  Dwarf_Half lle_op;
  ulong local_b8;
  Dwarf_CU_Context_conflict local_b0;
  dwarfstring m;
  char *attrname;
  Dwarf_Bool at_end;
  Dwarf_Unsigned *local_68;
  uint local_5c;
  char *formname;
  Dwarf_Ptr pvStack_50;
  undefined8 local_48;
  Dwarf_Unsigned DStack_40;
  
  if (attr == (Dwarf_Attribute)0x0) {
    pcVar13 = "DW_DLE_ATTR_NULLNULL Dwarf_Attribute argument passed to dwarf_get_loclist_c()";
    DVar19 = 0x6f;
LAB_001c2ee5:
    _dwarf_error_string((Dwarf_Debug)0x0,error,DVar19,pcVar13);
    return 1;
  }
  if ((attr->ar_dbg == (Dwarf_Debug)0x0) || (attr->ar_dbg->de_magic != 0xebfdebfd)) {
    pcVar13 = 
    "DW_DLE_DBG_NULL: dbg argument to dwarf_get_loclist_c()either null or it containsa stale Dwarf_Debug pointer"
    ;
    DVar19 = 0x51;
    goto LAB_001c2ee5;
  }
  m.s_data = (char *)((ulong)m.s_data & 0xffffffffffff0000);
  pDVar5 = attr->ar_cu_context;
  if (pDVar5 == (Dwarf_CU_Context_conflict)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x73);
    return 1;
  }
  dbg = pDVar5->cc_dbg;
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULL: dbg argument to _dwarf_get_loclist_lle_count()either null or it containsa stale Dwarf_Debug pointer"
                       );
    return 1;
  }
  local_68 = listlen_out;
  iVar9 = dwarf_whatform(attr,(Dwarf_Half *)&m,error);
  if (iVar9 != 0) {
    return iVar9;
  }
  uVar8 = (ushort)m.s_data;
  v = (ulong)m.s_data & 0xffff;
  uVar3 = attr->ar_attribute;
  uVar4 = pDVar5->cc_version_stamp;
  local_5c = (uint)uVar4;
  local_b8 = CONCAT44(local_b8._4_4_,(uint)pDVar5->cc_address_size);
  local_b0 = (Dwarf_CU_Context_conflict)0x0;
  if (1 < (ushort)m.s_data - 3) {
    if ((ushort)m.s_data - 6 < 2) {
      if ((uVar4 & 0xfffe) != 2) {
LAB_001c2f44:
        local_b8 = (ulong)local_5c;
        formname = "<unknownform>";
        attrname = "<unknown attribute>";
        local_68 = (Dwarf_Unsigned *)CONCAT44(local_68._4_4_,pDVar5->cc_is_dwo);
        dwarfstring_constructor(&m);
        dwarf_get_FORM_name((uint)uVar8,&formname);
        dwarf_get_AT_name((uint)uVar3,&attrname);
        dwarfstring_append_printf_u
                  (&m,"DW_DLE_LOC_EXPR_BAD: For Compilation Unit version %u",local_b8);
        dwarfstring_append_printf_u(&m,", attribute 0x%x (",(ulong)uVar3);
        dwarfstring_append(&m,attrname);
        dwarfstring_append_printf_u(&m,") form 0x%x (",v);
        dwarfstring_append(&m,formname);
        pcVar13 = ") (the CU is a .dwo) ";
        if ((int)local_68 == 0) {
          pcVar13 = ") (the CU is not a .dwo) ";
        }
        dwarfstring_append(&m,pcVar13);
        dwarfstring_append(&m," we don\'t understand the location");
        pcVar13 = dwarfstring_string(&m);
        _dwarf_error_string(dbg,error,0x80,pcVar13);
        dwarfstring_destructor(&m);
        return 1;
      }
      local_b0 = (Dwarf_CU_Context_conflict)0x1;
    }
    else if (1 < (ushort)m.s_data - 9) {
      if ((ushort)m.s_data == 0x17) {
        local_b0 = (Dwarf_CU_Context_conflict)0x5;
        if (uVar4 != 5) {
          local_b0 = (Dwarf_CU_Context_conflict)(ulong)((pDVar5->cc_is_dwo != 0 && uVar4 == 4) + 1);
        }
      }
      else if (((ushort)m.s_data != 0x18) &&
              (((ushort)m.s_data != 0x22 || (local_b0 = (Dwarf_CU_Context_conflict)0x5, uVar4 != 5))
              )) goto LAB_001c2f44;
    }
  }
  llhead = (Dwarf_Loc_Head_c)_dwarf_get_alloc(dbg,';',1);
  if (llhead == (Dwarf_Loc_Head_c)0x0) {
    _dwarf_error(dbg,error,0x3e);
    return 1;
  }
  llhead->ll_cuversion = (Dwarf_Half)local_5c;
  llhead->ll_lkind = (Dwarf_Half)local_b0;
  llhead->ll_attrnum = uVar3;
  llhead->ll_attrform = uVar8;
  llhead->ll_dbg = dbg;
  llhead->ll_address_size = (uint)local_b8;
  llhead->ll_offset_size = (uint)pDVar5->cc_length_size;
  llhead->ll_context = pDVar5;
  llhead->ll_magic = 0xadab4;
  llhead->ll_at_loclists_base_present = pDVar5->cc_loclists_base_present;
  llhead->ll_at_loclists_base = pDVar5->cc_loclists_base;
  llhead->ll_cu_base_address_present = pDVar5->cc_low_pc_present;
  llhead->ll_cu_base_address = pDVar5->cc_low_pc;
  llhead->ll_cu_addr_base = pDVar5->cc_addr_base;
  llhead->ll_cu_addr_base_present = pDVar5->cc_addr_base_present;
  iVar9 = (int)local_b0;
  if (iVar9 - 1U < 2) {
    m.s_data = (char *)0x0;
    iVar9 = dwarf_global_formref(attr,(Dwarf_Off *)&m,error);
    if (iVar9 != 0) goto LAB_001c315f;
    if ((dbg->de_debug_loc).dss_data == (Dwarf_Small *)0x0) {
      iVar9 = _dwarf_load_section(dbg,&dbg->de_debug_loc,error);
      if (iVar9 != 0) goto LAB_001c315f;
      pcVar13 = (char *)(dbg->de_debug_loc).dss_size;
      if (pcVar13 == (char *)0x0) {
LAB_001c3446:
        iVar9 = -1;
        goto LAB_001c315f;
      }
    }
    else {
      pcVar13 = (char *)(dbg->de_debug_loc).dss_size;
    }
    if (m.s_data < pcVar13) {
      formname = (char *)0x0;
      attrname = (char *)0x0;
      iVar9 = _dwarf_get_fission_addition_die
                        (attr->ar_die,5,(Dwarf_Unsigned *)&formname,(Dwarf_Unsigned *)&attrname,
                         error);
      if (iVar9 == 0) {
        if ((formname < pcVar13) &&
           (pcVar10 = formname + (long)m.s_data, m.s_data = pcVar10, pcVar10 < pcVar13)) {
          address_size = (Dwarf_Half)local_b8;
          if ((int)local_b0 == 2) {
            iVar15 = 1;
            pcVar13 = pcVar10;
            while( true ) {
              at_end = 0;
              iVar9 = _dwarf_read_loc_section_dwo
                                (dbg,(Dwarf_Block_c *)&m,(Dwarf_Addr *)&formname,
                                 (Dwarf_Addr *)&attrname,&at_end,&lle_op,(Dwarf_Off)pcVar13,
                                 address_size,2,error);
              if (iVar9 != 0) break;
              if (at_end != 0) goto LAB_001c3836;
              pcVar13 = m.s_data + m._24_8_;
              iVar15 = iVar15 + 1;
            }
          }
          else {
            iVar15 = 0;
            pcVar13 = pcVar10;
            while( true ) {
              formname = (char *)0x0;
              attrname = (char *)0x0;
              iVar9 = _dwarf_read_loc_section
                                (dbg,(Dwarf_Block_c *)&m,(Dwarf_Addr *)&formname,
                                 (Dwarf_Addr *)&attrname,(Dwarf_Half *)&at_end,(Dwarf_Off)pcVar13,
                                 address_size,error);
              if (iVar9 != 0) break;
              if (attrname == (char *)0x0 && formname == (char *)0x0) {
                if (iVar15 == 0) goto LAB_001c3446;
                goto LAB_001c3836;
              }
              iVar15 = iVar15 + 1;
              pcVar13 = m.s_data + m._24_8_;
            }
          }
        }
        else {
          _dwarf_error(dbg,error,0x164);
          iVar9 = 1;
        }
      }
      goto LAB_001c315f;
    }
    DVar19 = 0x164;
  }
  else {
    if (iVar9 == 5) {
      iVar9 = _dwarf_loclists_fill_in_lle_head(dbg,attr,llhead,error);
      if (iVar9 != 0) goto LAB_001c315f;
      lVar16 = 0x30;
      local_b0 = (Dwarf_CU_Context_conflict)llhead->ll_cu_base_address;
      DVar17 = llhead->ll_locdesc_count;
      pDVar5 = llhead->ll_context;
      uVar14 = 0;
      local_b8._0_4_ = (uint)(llhead->ll_cu_base_address_present == 0);
      while( true ) {
        iVar9 = -1;
        bVar18 = DVar17 == 0;
        DVar17 = DVar17 - 1;
        if (bVar18) break;
        pDVar11 = llhead->ll_locdesc;
        switch(*(undefined1 *)((long)pDVar11 + lVar16 + -0x2e)) {
        case 0:
        case 5:
          break;
        case 1:
          m.s_data = (char *)0x0;
          if ((uVar14 == 0) &&
             (iVar9 = _dwarf_look_in_local_and_tied_by_index
                                (dbg,pDVar5,*(Dwarf_Unsigned *)((long)pDVar11 + lVar16 + -0x18),
                                 (Dwarf_Addr *)&m,error), iVar9 == 0)) {
            local_b0 = (Dwarf_CU_Context_conflict)m.s_data;
            *(char **)((long)pDVar11 + lVar16 + -0x10) = m.s_data;
            uVar14 = 0;
            local_b8._0_4_ = uVar14;
          }
          else {
            *(undefined8 *)((long)pDVar11 + lVar16 + -0x10) = 0;
            *(undefined4 *)((long)pDVar11 + lVar16 + -0x2c) = 1;
            if ((error != (Dwarf_Error *)0x0) && (iVar9 == 1)) {
              dwarf_dealloc_error(dbg,*error);
              *error = (Dwarf_Error)0x0;
            }
            uVar14 = 1;
            local_b8._0_4_ = uVar14;
          }
          break;
        case 2:
          m.s_data = (char *)0x0;
          if ((uVar14 == 0) &&
             (iVar9 = _dwarf_look_in_local_and_tied_by_index
                                (dbg,pDVar5,*(Dwarf_Unsigned *)((long)pDVar11 + lVar16 + -0x18),
                                 (Dwarf_Addr *)&m,error), iVar9 == 0)) {
            *(char **)((long)pDVar11 + lVar16 + -0x10) = m.s_data;
            iVar15 = _dwarf_look_in_local_and_tied_by_index
                               (dbg,pDVar5,*(Dwarf_Unsigned *)((long)pDVar11 + lVar16 + -8),
                                (Dwarf_Addr *)&m,error);
            pcVar13 = m.s_data;
            if (iVar15 == 0) goto LAB_001c3733;
          }
          else {
            *(undefined8 *)((long)pDVar11 + lVar16 + -0x10) = 0;
            *(undefined4 *)((long)pDVar11 + lVar16 + -0x2c) = 1;
            iVar15 = -1;
            if ((error != (Dwarf_Error *)0x0) && (iVar15 = -1, iVar9 == 1)) {
              dwarf_dealloc_error(dbg,*error);
              *error = (Dwarf_Error)0x0;
              iVar15 = -1;
            }
          }
          iVar9 = iVar15;
          *(undefined8 *)((long)&pDVar11->ld_lkind + lVar16) = 0;
LAB_001c35fe:
          *(undefined4 *)((long)pDVar11 + lVar16 + -0x2c) = 1;
          uVar14 = 1;
          if ((error != (Dwarf_Error *)0x0) && (uVar14 = 1, iVar9 == 1)) {
            dwarf_dealloc_error(dbg,*error);
            *error = (Dwarf_Error)0x0;
            uVar14 = 1;
          }
          break;
        case 3:
          m.s_data = (char *)0x0;
          if ((uVar14 != 0) ||
             (iVar9 = _dwarf_look_in_local_and_tied_by_index
                                (dbg,pDVar5,*(Dwarf_Unsigned *)((long)pDVar11 + lVar16 + -0x18),
                                 (Dwarf_Addr *)&m,error), iVar9 != 0)) {
            *(undefined8 *)((long)pDVar11 + lVar16 + -0x10) = 0;
            goto LAB_001c35fe;
          }
          *(char **)((long)pDVar11 + lVar16 + -0x10) = m.s_data;
          pcVar13 = m.s_data + *(long *)((long)pDVar11 + lVar16 + -8);
LAB_001c3733:
          *(char **)((long)&pDVar11->ld_lkind + lVar16) = pcVar13;
          uVar14 = 0;
          break;
        case 4:
          if ((uint)local_b8 == 0) {
            *(char **)((long)pDVar11 + lVar16 + -0x10) =
                 (char *)((long)local_b0 + *(long *)((long)pDVar11 + lVar16 + -0x18));
            pcVar13 = (char *)((long)local_b0 + *(long *)((long)pDVar11 + lVar16 + -8));
            goto LAB_001c36b6;
          }
          *(undefined4 *)((long)pDVar11 + lVar16 + -0x2c) = 1;
          *(undefined8 *)((long)pDVar11 + lVar16 + -0x10) = 0;
          *(undefined8 *)((long)&pDVar11->ld_lkind + lVar16) = 0;
          local_b8._0_4_ = 1;
          break;
        case 6:
          pcVar13 = *(char **)((long)pDVar11 + lVar16 + -0x18);
          *(char **)((long)pDVar11 + lVar16 + -0x10) = pcVar13;
          local_b0 = (Dwarf_CU_Context_conflict)pcVar13;
LAB_001c36b6:
          *(char **)((long)&pDVar11->ld_lkind + lVar16) = pcVar13;
          local_b8._0_4_ = 0;
          break;
        case 7:
          *(undefined8 *)((long)pDVar11 + lVar16 + -0x10) =
               *(undefined8 *)((long)pDVar11 + lVar16 + -0x18);
          *(undefined8 *)((long)&pDVar11->ld_lkind + lVar16) =
               *(undefined8 *)((long)pDVar11 + lVar16 + -8);
          break;
        case 8:
          lVar6 = *(long *)((long)pDVar11 + lVar16 + -0x18);
          *(long *)((long)pDVar11 + lVar16 + -0x10) = lVar6;
          *(long *)((long)&pDVar11->ld_lkind + lVar16) =
               lVar6 + *(long *)((long)pDVar11 + lVar16 + -8);
          break;
        default:
          dwarfstring_constructor(&m);
          dwarfstring_append_printf_u
                    (&m,
                     "DW_DLE_LOCLISTS_ERROR: improper DW_LLE code of 0x%x is unknown. DWARF5 loclists error"
                     ,(ulong)*(byte *)((long)pDVar11 + lVar16 + -0x2e));
          pcVar13 = dwarfstring_string(&m);
          _dwarf_error_string(dbg,error,0x1d5,pcVar13);
          dwarfstring_destructor(&m);
          dwarf_dealloc_loc_head_c(llhead);
          return 1;
        }
        lVar16 = lVar16 + 0x98;
      }
LAB_001c3bae:
      *ll_header_out = llhead;
      *local_68 = llhead->ll_locdesc_count;
      return 0;
    }
    if (iVar9 != 0) goto LAB_001c3bae;
    m.s_avail = 0;
    m.s_malloc = '\0';
    m._25_7_ = 0;
    m.s_data = (char *)0x0;
    m.s_size = 0;
    if (uVar8 == 0x18) {
      iVar9 = dwarf_formexprloc(attr,(Dwarf_Unsigned *)&m,(Dwarf_Ptr *)&m.s_size,error);
      if (iVar9 != 0) goto LAB_001c315f;
      m.s_avail = CONCAT62(m.s_avail._2_6_,llhead->ll_lkind);
      m._24_8_ = m.s_size - (long)(dbg->de_debug_info).dss_data;
    }
    else {
      local_48._0_1_ = '\0';
      local_48._1_7_ = 0;
      DStack_40 = 0;
      formname = (char *)0x0;
      pvStack_50 = (Dwarf_Ptr)0x0;
      iVar9 = _dwarf_formblock_internal(dbg,attr,pDVar5,(Dwarf_Block *)&formname,error);
      if (iVar9 != 0) goto LAB_001c315f;
      m.s_data = formname;
      m.s_size = (size_t)pvStack_50;
      m.s_avail = CONCAT62(m.s_avail._2_6_,llhead->ll_lkind);
      m._24_8_ = DStack_40;
    }
    pDVar11 = (Dwarf_Locdesc_c)_dwarf_get_alloc(dbg,':',1);
    if (pDVar11 != (Dwarf_Locdesc_c)0x0) {
      highpc = 0xffffffffffffffff;
      if ((uint)local_b8 != 8) {
        highpc = 0xffffffff;
      }
      pDVar11->ld_magic = 0xadab4;
      llhead->ll_locdesc = pDVar11;
      llhead->ll_locdesc_count = 1;
      iVar9 = _dwarf_fill_in_locdesc_op_c
                        (dbg,0,llhead,(Dwarf_Block_c *)&m,(Dwarf_Half)llhead->ll_address_size,
                         (ushort)pDVar5->cc_length_size,pDVar5->cc_version_stamp,0,highpc,0,error);
      llhead->ll_bytes_total = (Dwarf_Unsigned)(m.s_data + llhead->ll_bytes_total);
      if (iVar9 != 0) {
        dwarf_dealloc(dbg,llhead->ll_locdesc,0x3a);
        llhead->ll_locdesc = (Dwarf_Locdesc_c)0x0;
        llhead->ll_locdesc_count = 0;
        goto LAB_001c315f;
      }
      goto LAB_001c3bae;
    }
    DVar19 = 0x3e;
  }
  goto LAB_001c3741;
LAB_001c3836:
  local_b8 = (ulong)iVar15;
  pDVar11 = (Dwarf_Locdesc_c)_dwarf_get_alloc(dbg,':',local_b8);
  if (pDVar11 != (Dwarf_Locdesc_c)0x0) {
    pDVar11->ld_magic = 0xadab4;
    llhead->ll_locdesc = pDVar11;
    llhead->ll_locdesc_count = local_b8;
    pDVar7 = llhead->ll_context;
    llhead->ll_llearea_offset = (Dwarf_Unsigned)pcVar10;
    pcVar13 = pcVar10;
    for (DVar17 = 0; local_b8 != DVar17; DVar17 = DVar17 + 1) {
      lle_op = 0;
      formname = (char *)0x0;
      attrname = (char *)0x0;
      m.s_data = (char *)0x0;
      m.s_size = 0;
      m.s_avail = 0;
      m.s_malloc = '\0';
      m._25_7_ = 0;
      if ((int)local_b0 == 2) {
        iVar9 = _dwarf_read_loc_section_dwo
                          (dbg,(Dwarf_Block_c *)&m,(Dwarf_Addr *)&formname,(Dwarf_Addr *)&attrname,
                           &at_end,&lle_op,(Dwarf_Off)pcVar13,address_size,2,error);
      }
      else {
        iVar9 = _dwarf_read_loc_section
                          (dbg,(Dwarf_Block_c *)&m,(Dwarf_Addr *)&formname,(Dwarf_Addr *)&attrname,
                           &lle_op,(Dwarf_Off)pcVar13,address_size,error);
      }
      if ((iVar9 != 0) ||
         (iVar9 = _dwarf_fill_in_locdesc_op_c
                            (dbg,DVar17,llhead,(Dwarf_Block_c *)&m,address_size,
                             (ushort)pDVar7->cc_length_size,pDVar7->cc_version_stamp,
                             (Dwarf_Addr)formname,(Dwarf_Addr)attrname,lle_op,error), iVar9 != 0))
      goto LAB_001c315f;
      pcVar13 = m.s_data + m._24_8_;
    }
    llhead->ll_bytes_total = (long)pcVar13 - (long)pcVar10;
    DVar17 = llhead->ll_locdesc_count;
    local_b8 = llhead->ll_cu_base_address;
    if ((int)local_b0 == 1) {
      lVar16 = 0x30;
      while (bVar18 = DVar17 != 0, DVar17 = DVar17 - 1, bVar18) {
        pDVar11 = llhead->ll_locdesc;
        cVar1 = *(char *)((long)pDVar11 + lVar16 + -0x2e);
        if (cVar1 != '\0') {
          if (cVar1 == '\x04') {
            *(ulong *)((long)pDVar11 + lVar16 + -0x10) =
                 *(long *)((long)pDVar11 + lVar16 + -0x18) + local_b8;
            DVar12 = *(long *)((long)pDVar11 + lVar16 + -8) + local_b8;
          }
          else {
            if (cVar1 != '\x06') {
              dwarfstring_constructor(&m);
              bVar2 = *(byte *)((long)pDVar11 + lVar16 + -0x2e);
              pcVar13 = 
              "DW_DLE_LOCLISTS_ERROR: improper synthesized LLE code of 0x%x is unknown. In standard DWARF3/4 loclist"
              ;
              goto LAB_001c3bfb;
            }
            DVar12 = *(Dwarf_Unsigned *)((long)pDVar11 + lVar16 + -8);
            *(Dwarf_Unsigned *)((long)pDVar11 + lVar16 + -0x10) = DVar12;
            local_b8 = DVar12;
          }
          *(Dwarf_Unsigned *)((long)&pDVar11->ld_lkind + lVar16) = DVar12;
        }
        lVar16 = lVar16 + 0x98;
      }
    }
    else {
      local_b0 = llhead->ll_context;
      lVar16 = 0x30;
      while (bVar18 = DVar17 != 0, DVar17 = DVar17 - 1, bVar18) {
        pDVar11 = llhead->ll_locdesc;
        switch(*(undefined1 *)((long)pDVar11 + lVar16 + -0x2e)) {
        case 0:
          goto switchD_001c3a51_caseD_0;
        case 1:
          m.s_data = (char *)0x0;
          iVar9 = _dwarf_look_in_local_and_tied_by_index
                            (dbg,local_b0,*(Dwarf_Unsigned *)((long)pDVar11 + lVar16 + -8),
                             (Dwarf_Addr *)&m,error);
          if (iVar9 == 0) {
            *(char **)((long)pDVar11 + lVar16 + -0x10) = m.s_data;
            pcVar13 = m.s_data;
            break;
          }
          *(undefined8 *)((long)pDVar11 + lVar16 + -0x10) = 0;
LAB_001c3b51:
          *(undefined8 *)((long)&pDVar11->ld_lkind + lVar16) = 0;
LAB_001c3b56:
          *(undefined4 *)((long)pDVar11 + lVar16 + -0x2c) = 1;
          if ((error != (Dwarf_Error *)0x0) && (iVar9 == 1)) {
            dwarf_dealloc_error(dbg,*error);
            *error = (Dwarf_Error)0x0;
          }
          goto switchD_001c3a51_caseD_0;
        case 2:
          m.s_data = (char *)0x0;
          iVar9 = _dwarf_look_in_local_and_tied_by_index
                            (dbg,local_b0,*(Dwarf_Unsigned *)((long)pDVar11 + lVar16 + -0x18),
                             (Dwarf_Addr *)&m,error);
          if (iVar9 == 0) {
            *(char **)((long)pDVar11 + lVar16 + -0x10) = m.s_data;
          }
          else {
            *(undefined8 *)((long)pDVar11 + lVar16 + -0x10) = 0;
            *(undefined4 *)((long)pDVar11 + lVar16 + -0x2c) = 1;
            if ((error != (Dwarf_Error *)0x0) && (iVar9 == 1)) {
              dwarf_dealloc_error(dbg,*error);
              *error = (Dwarf_Error)0x0;
            }
          }
          iVar9 = _dwarf_look_in_local_and_tied_by_index
                            (dbg,local_b0,*(Dwarf_Unsigned *)((long)pDVar11 + lVar16 + -0x18),
                             (Dwarf_Addr *)&m,error);
          pcVar13 = m.s_data;
          if (iVar9 != 0) goto LAB_001c3b51;
          break;
        case 3:
          m.s_data = (char *)0x0;
          iVar9 = _dwarf_look_in_local_and_tied_by_index
                            (dbg,local_b0,*(Dwarf_Unsigned *)((long)pDVar11 + lVar16 + -0x18),
                             (Dwarf_Addr *)&m,error);
          if (iVar9 != 0) {
            *(undefined8 *)((long)pDVar11 + lVar16 + -0x10) = 0;
            goto LAB_001c3b56;
          }
          *(char **)((long)pDVar11 + lVar16 + -0x10) = m.s_data;
          pcVar13 = m.s_data + *(long *)((long)pDVar11 + lVar16 + -8);
          break;
        case 4:
          *(ulong *)((long)pDVar11 + lVar16 + -0x10) =
               *(long *)((long)pDVar11 + lVar16 + -0x18) + local_b8;
          pcVar13 = (char *)(*(long *)((long)pDVar11 + lVar16 + -8) + local_b8);
          break;
        default:
          dwarfstring_constructor(&m);
          bVar2 = *(byte *)((long)pDVar11 + lVar16 + -0x2e);
          pcVar13 = 
          "DW_DLE_LOCLISTS_ERROR: improper LLEX code of 0x%x is unknown. GNU LLEX dwo loclists error"
          ;
LAB_001c3bfb:
          dwarfstring_append_printf_u(&m,pcVar13,(ulong)bVar2);
          pcVar13 = dwarfstring_string(&m);
          _dwarf_error_string(dbg,error,0x1d5,pcVar13);
          dwarfstring_destructor(&m);
          iVar9 = 1;
          goto LAB_001c315f;
        }
        *(char **)((long)&pDVar11->ld_lkind + lVar16) = pcVar13;
switchD_001c3a51_caseD_0:
        lVar16 = lVar16 + 0x98;
      }
    }
    goto LAB_001c3bae;
  }
  DVar19 = 0x3e;
LAB_001c3741:
  _dwarf_error(dbg,error,DVar19);
  iVar9 = 1;
LAB_001c315f:
  dwarf_dealloc_loc_head_c(llhead);
  return iVar9;
}

Assistant:

int
dwarf_get_loclist_c(Dwarf_Attribute attr,
    Dwarf_Loc_Head_c * ll_header_out,
    Dwarf_Unsigned   * listlen_out,
    Dwarf_Error      * error)
{
    Dwarf_Debug dbg = 0;
    Dwarf_Half form          = 0;
    Dwarf_Loc_Head_c llhead  = 0;
    Dwarf_CU_Context cucontext = 0;
    unsigned address_size    = 0;
    Dwarf_Half cuversionstamp       = 0;
    Dwarf_Bool is_cu         = FALSE;
    Dwarf_Unsigned attrnum   = 0;
    Dwarf_Bool is_dwo        = 0;
    int setup_res            = DW_DLV_ERROR;
    int lkind                = 0;

    if (!attr) {
        _dwarf_error_string(dbg, error,DW_DLE_ATTR_NULL,
            "DW_DLE_ATTR_NULL"
            "NULL Dwarf_Attribute "
            "argument passed to "
            "dwarf_get_loclist_c()");
        return DW_DLV_ERROR;
    }
    dbg = attr->ar_dbg;
    CHECK_DBG(dbg,error,"dwarf_get_loclist_c()");

    /* ***** BEGIN CODE ***** */
    setup_res = _dwarf_setup_loc(attr, &dbg,&cucontext, &form, error);
    if (setup_res != DW_DLV_OK) {
        return setup_res;
    }
    attrnum = attr->ar_attribute;
    cuversionstamp = cucontext->cc_version_stamp;
    address_size = cucontext->cc_address_size;
    is_dwo = cucontext->cc_is_dwo;
    lkind = determine_location_lkind(cuversionstamp,
        form, is_dwo);
    if (lkind == DW_LKIND_unknown) {
        dwarfstring m;
        const char * formname = "<unknownform>";
        const char * attrname = "<unknown attribute>";

        dwarfstring_constructor(&m);
        dwarf_get_FORM_name((unsigned int)form,&formname);
        dwarf_get_AT_name((unsigned int)attrnum,&attrname);
        dwarfstring_append_printf_u(&m,
            "DW_DLE_LOC_EXPR_BAD: For Compilation Unit "
            "version %u",cuversionstamp);
        dwarfstring_append_printf_u(&m,
            ", attribute 0x%x (",attrnum);
        dwarfstring_append(&m,(char *)attrname);
        dwarfstring_append_printf_u(&m,
            ") form 0x%x (",form);
        dwarfstring_append(&m,(char *)formname);
        if (is_dwo) {
            dwarfstring_append(&m,") (the CU is a .dwo) ");
        } else {
            dwarfstring_append(&m,") (the CU is not a .dwo) ");
        }
        dwarfstring_append(&m," we don't understand the location");
        _dwarf_error_string(dbg,error,DW_DLE_LOC_EXPR_BAD,
            dwarfstring_string(&m));
        dwarfstring_destructor(&m);
        return DW_DLV_ERROR;
    }
    /*  Doing this early (first) to avoid repeating the alloc code
        for each type  */
    llhead = (Dwarf_Loc_Head_c)
        _dwarf_get_alloc(dbg, DW_DLA_LOC_HEAD_C, 1);
    if (!llhead) {
        _dwarf_error(dbg, error, DW_DLE_ALLOC_FAIL);
        return DW_DLV_ERROR;
    }
    llhead->ll_cuversion = cuversionstamp;
    llhead->ll_lkind = lkind;
    llhead->ll_attrnum = (Dwarf_Half)attrnum;
    llhead->ll_attrform = (Dwarf_Half)form;
    llhead->ll_dbg = dbg;
    llhead->ll_address_size = address_size;
    llhead->ll_offset_size = cucontext->cc_length_size;
    llhead->ll_context = cucontext;
    llhead->ll_magic = LOCLISTS_MAGIC;

    llhead->ll_at_loclists_base_present =
        cucontext->cc_loclists_base_present;
    llhead->ll_at_loclists_base =  cucontext->cc_loclists_base;
    llhead->ll_cu_base_address_present = cucontext->cc_low_pc_present;
    llhead->ll_cu_base_address = cucontext->cc_low_pc;
    llhead->ll_cu_addr_base = cucontext->cc_addr_base;
    llhead->ll_cu_addr_base_present =
        cucontext->cc_addr_base_present;

    if (lkind == DW_LKIND_loclist ||
        lkind == DW_LKIND_GNU_exp_list) {
        int ores = 0;
        /* Here we have a loclist to deal with. */
        ores = context_is_cu_not_tu(cucontext,&is_cu);
        if (ores != DW_DLV_OK) {
            dwarf_dealloc_loc_head_c(llhead);
            return setup_res;
        }
        ores = _dwarf_original_loclist_build(dbg,
            llhead, attr, error);
        if (ores != DW_DLV_OK) {
            dwarf_dealloc_loc_head_c(llhead);
            return ores;
        }
        if (lkind == DW_LKIND_loclist) {
            ores = cook_original_loclist_contents(dbg,llhead,
                error);
        } else {
            ores = cook_gnu_loclist_contents(dbg,llhead,error);
        }
        if (ores != DW_DLV_OK) {
            dwarf_dealloc_loc_head_c(llhead);
            return ores;
        }
    } else if (lkind == DW_LKIND_expression) {
        /* DWARF2,3,4,5 */
        int eres = 0;
        eres = _dwarf_original_expression_build(dbg,
            llhead, attr, error);
        if (eres != DW_DLV_OK) {
            dwarf_dealloc_loc_head_c(llhead);
            return eres;
        }
    } else if (lkind == DW_LKIND_loclists) {
        /* DWARF5! */
        int leres = 0;

        leres = _dwarf_loclists_fill_in_lle_head(dbg,
            attr,llhead,error);
        if (leres != DW_DLV_OK) {
            dwarf_dealloc_loc_head_c(llhead);
            return leres;
        }
        leres = cook_loclists_contents(dbg,llhead,error);
        if (leres != DW_DLV_OK) {
            dwarf_dealloc_loc_head_c(llhead);
            return leres;
        }
    } /* ASSERT else impossible */
    *ll_header_out = llhead;
    *listlen_out = llhead->ll_locdesc_count;
    return DW_DLV_OK;
}